

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_address.cpp
# Opt level: O0

void __thiscall
cfdcapi_address_CfdGetAddressInfoTest_Test::TestBody
          (cfdcapi_address_CfdGetAddressInfoTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *message;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char **in_stack_00000230;
  int *in_stack_00000238;
  AssertionResult gtest_ar_1;
  char *hash;
  char *locking_script;
  int witness_version;
  int hash_type;
  int network;
  size_t idx;
  size_t list_size;
  CfdGetAddressExpectData exp_datas [14];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffab8;
  AssertionResult *in_stack_fffffffffffffac0;
  CfdErrorCode *in_stack_fffffffffffffac8;
  char *in_stack_fffffffffffffad0;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffad8;
  undefined1 in_stack_fffffffffffffadf;
  undefined7 in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb57;
  char *in_stack_fffffffffffffb58;
  AssertHelper local_438;
  Message local_430;
  undefined4 local_424;
  AssertionResult local_420;
  AssertHelper local_410;
  Message local_408;
  AssertionResult local_400;
  char *local_3f0;
  AssertHelper local_3e8;
  Message local_3e0;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  AssertionResult local_3b8;
  AssertHelper local_3a8;
  Message local_3a0;
  AssertionResult local_398;
  AssertHelper local_388;
  Message local_380;
  AssertionResult local_378;
  AssertHelper local_368;
  Message local_360;
  AssertionResult local_358;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_30c;
  AssertionResult local_308;
  char *local_2f8;
  char *local_2f0;
  undefined4 local_2e4;
  undefined4 local_2e0;
  undefined4 local_2dc;
  ulong local_2d8;
  ulong local_2d0;
  undefined1 local_2c8 [8];
  undefined8 auStack_2c0 [69];
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
             in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30b54a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x230,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x30b5ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30b602);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,(type *)0x30b636);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x231,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x30b732);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30b7ad);
  memcpy(local_2c8,&PTR_anon_var_dwarf_119760_00b5d200,0x230);
  local_2d0 = 0xe;
  for (local_2d8 = 0; local_2d8 < local_2d0; local_2d8 = local_2d8 + 1) {
    local_2dc = 0;
    local_2e0 = 0;
    local_2e4 = 0;
    local_2f0 = (char *)0x0;
    local_2f8 = (char *)0x0;
    local_14 = CfdGetAddressInfo(locking_script,hash,(int *)gtest_ar_1.message_.ptr_,
                                 (int *)gtest_ar_1._0_8_,in_stack_00000238,in_stack_00000230,
                                 (char **)idx);
    local_30c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
               in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30b930);
      testing::internal::AssertHelper::AssertHelper
                (&local_320,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                 ,0x2ba,pcVar2);
      testing::internal::AssertHelper::operator=(&local_320,&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_320);
      testing::Message::~Message((Message *)0x30b993);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x30b9eb);
    if (local_14 == 0) {
      local_334 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                 in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                 (int *)in_stack_fffffffffffffac0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
      if (!bVar1) {
        testing::Message::Message(&local_340);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30baa6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_348,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,700,pcVar2);
        testing::internal::AssertHelper::operator=(&local_348,&local_340);
        testing::internal::AssertHelper::~AssertHelper(&local_348);
        testing::Message::~Message((Message *)0x30bb09);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30bb5e);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                 in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                 (int *)in_stack_fffffffffffffac0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
      if (!bVar1) {
        testing::Message::Message(&local_360);
        in_stack_fffffffffffffb58 =
             testing::AssertionResult::failure_message((AssertionResult *)0x30bc0c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_368,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2bd,in_stack_fffffffffffffb58);
        testing::internal::AssertHelper::operator=(&local_368,&local_360);
        testing::internal::AssertHelper::~AssertHelper(&local_368);
        testing::Message::~Message((Message *)0x30bc6f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30bcc4);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                 in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                 (int *)in_stack_fffffffffffffac0);
      in_stack_fffffffffffffb57 = testing::AssertionResult::operator_cast_to_bool(&local_378);
      if (!(bool)in_stack_fffffffffffffb57) {
        testing::Message::Message(&local_380);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30bd72);
        testing::internal::AssertHelper::AssertHelper
                  (&local_388,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2be,pcVar2);
        testing::internal::AssertHelper::operator=(&local_388,&local_380);
        testing::internal::AssertHelper::~AssertHelper(&local_388);
        testing::Message::~Message((Message *)0x30bdd5);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30be2a);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((char *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
                 in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                 (int *)in_stack_fffffffffffffac0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
      if (!bVar1) {
        testing::Message::Message(&local_3a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30bed2);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2bf,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
        testing::internal::AssertHelper::~AssertHelper(&local_3a8);
        testing::Message::~Message((Message *)0x30bf2f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30bf84);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3b8,"exp_datas[idx].locking_script","locking_script",
                 (char *)auStack_2c0[local_2d8 * 5],local_2f0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b8);
      if (!bVar1) {
        testing::Message::Message(&local_3c0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30c026);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2c0,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
        testing::internal::AssertHelper::~AssertHelper(&local_3c8);
        testing::Message::~Message((Message *)0x30c083);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30c0d8);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_3d8,"exp_datas[idx].hash","hash",
                 (char *)auStack_2c0[local_2d8 * 5 + 1],local_2f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      if (!bVar1) {
        testing::Message::Message(&local_3e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30c17a);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                   ,0x2c1,pcVar2);
        testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
        testing::internal::AssertHelper::~AssertHelper(&local_3e8);
        testing::Message::~Message((Message *)0x30c1d7);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x30c22c);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffac8);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffac8);
    }
    else {
      local_3f0 = (char *)0x0;
      local_14 = CfdGetLastErrorMessage
                           (in_stack_fffffffffffffb58,
                            (char **)CONCAT17(in_stack_fffffffffffffb57,in_stack_fffffffffffffb50));
      if (local_14 == 0) {
        testing::internal::CmpHelperSTREQ((internal *)&local_400,"\"\"","message","",local_3f0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
        if (!bVar1) {
          testing::Message::Message(&local_408);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30c316);
          testing::internal::AssertHelper::AssertHelper
                    (&local_410,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
                     ,0x2c8,pcVar2);
          testing::internal::AssertHelper::operator=(&local_410,&local_408);
          testing::internal::AssertHelper::~AssertHelper(&local_410);
          testing::Message::~Message((Message *)0x30c373);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x30c3c8);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffac8);
      }
    }
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffac8);
  local_424 = 0;
  this_00 = &local_420;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT17(in_stack_fffffffffffffadf,in_stack_fffffffffffffad8),
             &this_00->success_,in_stack_fffffffffffffac8,(int *)in_stack_fffffffffffffac0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x30c4a9);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_address.cpp"
               ,0x2cf,pcVar2);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message((Message *)0x30c506);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x30c55b);
  return;
}

Assistant:

TEST(cfdcapi_address, CfdGetAddressInfoTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdGetAddressExpectData {
    const char* address;
    const char* locking_script;
    const char* hash;
    int network;
    int hash_type;
    int witness_version;
  };
  const struct CfdGetAddressExpectData exp_datas[] = {
    { // HashType(P2PKH) mainnet
      "1PMycacnJaSqwwJqjawXBErnLsZ7RkXUAs",
      "76a914f54a5851e9372b87810a8e60cdd2e7cfd80b6e3188ac",
      "f54a5851e9372b87810a8e60cdd2e7cfd80b6e31",
      kCfdNetworkMainnet,
      kCfdP2pkh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2PKH) testnet
      "mjawtDFWiNppWUqczgQevgyg6Hg7J8Uxcg",
      "76a9142ca1d2e7214b16725cf6310867460633a061edcb88ac",
      "2ca1d2e7214b16725cf6310867460633a061edcb",
      kCfdNetworkTestnet,
      kCfdP2pkh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2SH) mainnet
      "3KxE77EHe1ip6WGRifwr9fZ5WBDGsLyWFz",
      "a914c852ac34a1c76b63a279c97502c9ccc4e3cb9e8b87",
      "c852ac34a1c76b63a279c97502c9ccc4e3cb9e8b",
      kCfdNetworkMainnet,
      kCfdP2sh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2SH) testnet
      "2NEbifo1SsiCYMQhGxGCg3tcTzR8xHuhqeH",
      "a914ea3ae70e53e6e2813002738cba26bd0cfcdecb0687",
      "ea3ae70e53e6e2813002738cba26bd0cfcdecb06",
      kCfdNetworkTestnet,
      kCfdP2sh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2SH-P2WPKH) mainnet
      "3JvL6Ymt8MVWiCNHC7oWU6nLeHNJKLZGLN",
      "a914bcfeb728b584253d5f3f70bcb780e9ef218a68f487",
      "bcfeb728b584253d5f3f70bcb780e9ef218a68f4",
      kCfdNetworkMainnet,
      kCfdP2sh,
      kCfdWitnessVersionNone,
    },
    { // HashType(P2WPKH) mainnet
      "bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",
      "0014751e76e8199196d454941c45d1b3a323f1433bd6",
      "751e76e8199196d454941c45d1b3a323f1433bd6",
      kCfdNetworkMainnet,
      kCfdP2wpkh,
      kCfdWitnessVersion0,
    },
    { // HashType(P2WPKH) testnet
      "tb1qw508d6qejxtdg4y5r3zarvary0c5xw7kxpjzsx",
      "0014751e76e8199196d454941c45d1b3a323f1433bd6",
      "751e76e8199196d454941c45d1b3a323f1433bd6",
      kCfdNetworkTestnet,
      kCfdP2wpkh,
      kCfdWitnessVersion0,
    },
    { // HashType(P2WSH) mainnet
      "bc1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3qccfmv3",
      "00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262",
      "1863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262",
      kCfdNetworkMainnet,
      kCfdP2wsh,
      kCfdWitnessVersion0,
    },
    { // HashType(P2WSH) testnet
      "tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7",
      "00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262",
      "1863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262",
      kCfdNetworkTestnet,
      kCfdP2wsh,
      kCfdWitnessVersion0,
    },
    { // HashType(Taproot) mainnet
      "bc1pzamhq9jglfxaj0r5ahvatr8uc77u973s5tm04yytdltsey5r8naspp3kr4",
      "51201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      "1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      kCfdNetworkMainnet,
      kCfdTaproot,
      kCfdWitnessVersion1,
    },
#ifndef CFD_DISABLE_ELEMENTS
    { // Elements HashType(P2PKH) liquidv1
      "QKXGAM4Cvd1fvLEz5tbq4YwNRzTjdMWi2q",
      "76a914f42331c418ef4517ba644ad6e9fc99681ad4393788ac",
      "f42331c418ef4517ba644ad6e9fc99681ad43937",
      kCfdNetworkLiquidv1,
      kCfdP2pkh,
      kCfdWitnessVersionNone,
    },
    { // Elements HashType(P2SH) regtest
      "XRpicZNrFZumBMhRV5BSYW28pGX7JyY1ua",
      "a9149ec42b6cfa1b0bc3f55f07af29867057cb0b8a2e87",
      "9ec42b6cfa1b0bc3f55f07af29867057cb0b8a2e",
      kCfdNetworkElementsRegtest,
      kCfdP2sh,
      kCfdWitnessVersionNone,
    },
    { // Elements HashType(P2WPKH) regtest
      "ert1q57etrknhl75e64jmqrvl0vwzu39xjpagaw9ynw",
      "0014a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a8",
      "a7b2b1da77ffa99d565b00d9f7b1c2e44a6907a8",
      kCfdNetworkElementsRegtest,
      kCfdP2wpkh,
      kCfdWitnessVersion0,
    },
    { // Elements HashType(P2WSH) liquidv1
      "ex1q6tayh53l97qhs7fr98x8msgmn82egptfhpkyn53vkt22lrxswztsgnpmxp",
      "0020d2fa4bd23f2f8178792329cc7dc11b99d5940569b86c49d22cb2d4af8cd07097",
      "d2fa4bd23f2f8178792329cc7dc11b99d5940569b86c49d22cb2d4af8cd07097",
      kCfdNetworkLiquidv1,
      kCfdP2wsh,
      kCfdWitnessVersion0,
    },
#endif  // CFD_DISABLE_ELEMENTS
  };
  size_t list_size = sizeof(exp_datas) / sizeof(struct CfdGetAddressExpectData);

  for (size_t idx = 0; idx < list_size; ++idx) {
    int network = 0;
    int hash_type = 0;
    int witness_version = 0;
    char* locking_script = nullptr;
    char* hash = nullptr;
    ret = CfdGetAddressInfo(
        handle, exp_datas[idx].address, &network, &hash_type,
        &witness_version, &locking_script, &hash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(kCfdSuccess, ret);
      EXPECT_EQ(exp_datas[idx].network, network);
      EXPECT_EQ(exp_datas[idx].hash_type, hash_type);
      EXPECT_EQ(exp_datas[idx].witness_version, witness_version);
      EXPECT_STREQ(exp_datas[idx].locking_script, locking_script);
      EXPECT_STREQ(exp_datas[idx].hash, hash);
      CfdFreeStringBuffer(locking_script);
      CfdFreeStringBuffer(hash);
    } else {
      char* message = nullptr;
      ret = CfdGetLastErrorMessage(handle, &message);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("", message);
        CfdFreeStringBuffer(message);
      }
    }
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}